

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int rc_pick_q_and_bounds_no_stats_cbr
              (AV1_COMP *cpi,int width,int height,int *bottom_index,int *top_index)

{
  int iVar1;
  int iVar2;
  int iVar3;
  AV1_COMP *cpi_00;
  int *in_RCX;
  long *in_RDI;
  int *in_R8;
  int qdelta;
  int active_best_quality;
  int active_worst_quality;
  int q;
  CurrentFrame *current_frame;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  AV1_COMMON *cm;
  int local_54;
  int in_stack_ffffffffffffffbc;
  long *rate_target_ratio;
  AV1_COMP *cpi_01;
  
  rate_target_ratio = in_RDI + 0x77f0;
  cpi_01 = (AV1_COMP *)(in_RDI + 0xc0ee);
  cpi_00 = (AV1_COMP *)(*in_RDI + 0x8b30);
  iVar1 = calc_active_worst_quality_no_stats_cbr((AV1_COMP *)rc);
  iVar2 = calc_active_best_quality_no_stats_cbr
                    ((AV1_COMP *)p_rc,current_frame._4_4_,(int)current_frame,q);
  iVar2 = clamp(iVar2,*(int *)(cpi_01->enc_quant_dequant_params).quants.y_quant[0xb],
                *(int *)((cpi_01->enc_quant_dequant_params).quants.y_quant[10] + 6));
  iVar1 = clamp(iVar1,iVar2,*(int *)((cpi_01->enc_quant_dequant_params).quants.y_quant[10] + 6));
  *in_R8 = iVar1;
  *in_RCX = iVar2;
  if ((((char)*rate_target_ratio == '\0') &&
      (*(int *)((cpi_00->enc_quant_dequant_params).quants.y_zbin[0x12] + 4) == 0)) &&
     ((int)rate_target_ratio[2] != 0)) {
    iVar3 = av1_compute_qdelta_by_rate
                      (cpi_01,(FRAME_TYPE)((ulong)cpi_00 >> 0x38),(int)cpi_00,
                       (double)rate_target_ratio);
    *in_R8 = iVar1 + iVar3;
    if (*in_RCX < *in_R8) {
      local_54 = *in_R8;
    }
    else {
      local_54 = *in_RCX;
    }
    *in_R8 = local_54;
  }
  iVar1 = av1_rc_regulate_q(cpi_00,(int)((ulong)rate_target_ratio >> 0x20),(int)rate_target_ratio,
                            in_stack_ffffffffffffffbc,iVar1,iVar2);
  if (*in_R8 < iVar1) {
    if (*(int *)((long)&cpi_01->ppi + 4) <
        *(int *)((cpi_01->enc_quant_dequant_params).quants.y_quant[7] + 6)) {
      iVar1 = *in_R8;
    }
    else {
      *in_R8 = iVar1;
    }
  }
  return iVar1;
}

Assistant:

static int rc_pick_q_and_bounds_no_stats_cbr(const AV1_COMP *cpi, int width,
                                             int height, int *bottom_index,
                                             int *top_index) {
  const AV1_COMMON *const cm = &cpi->common;
  const RATE_CONTROL *const rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const CurrentFrame *const current_frame = &cm->current_frame;
  int q;
  int active_worst_quality = calc_active_worst_quality_no_stats_cbr(cpi);
  int active_best_quality = calc_active_best_quality_no_stats_cbr(
      cpi, active_worst_quality, width, height);
  assert(has_no_stats_stage(cpi));
  assert(cpi->oxcf.rc_cfg.mode == AOM_CBR);

  // Clip the active best and worst quality values to limits
  active_best_quality =
      clamp(active_best_quality, rc->best_quality, rc->worst_quality);
  active_worst_quality =
      clamp(active_worst_quality, active_best_quality, rc->worst_quality);

  *top_index = active_worst_quality;
  *bottom_index = active_best_quality;

  // Limit Q range for the adaptive loop.
  if (current_frame->frame_type == KEY_FRAME && !p_rc->this_key_frame_forced &&
      current_frame->frame_number != 0) {
    int qdelta = 0;
    qdelta = av1_compute_qdelta_by_rate(cpi, current_frame->frame_type,
                                        active_worst_quality, 2.0);
    *top_index = active_worst_quality + qdelta;
    *top_index = AOMMAX(*top_index, *bottom_index);
  }

  q = av1_rc_regulate_q(cpi, rc->this_frame_target, active_best_quality,
                        active_worst_quality, width, height);
#if RT_PASSIVE_STRATEGY
  if (current_frame->frame_type != KEY_FRAME &&
      cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN) {
    q = get_q_passive_strategy(cpi, q, 50);
  }
#endif  // RT_PASSIVE_STRATEGY
  if (q > *top_index) {
    // Special case when we are targeting the max allowed rate
    if (rc->this_frame_target >= rc->max_frame_bandwidth)
      *top_index = q;
    else
      q = *top_index;
  }

  assert(*top_index <= rc->worst_quality && *top_index >= rc->best_quality);
  assert(*bottom_index <= rc->worst_quality &&
         *bottom_index >= rc->best_quality);
  assert(q <= rc->worst_quality && q >= rc->best_quality);
  return q;
}